

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommsBroker_impl.hpp
# Opt level: O0

void __thiscall
helics::CommsBroker<helics::zeromq::ZmqCommsSS,helics::CommonCore>::~CommsBroker
          (CommsBroker<helics::zeromq::ZmqCommsSS,helics::CommonCore> *this)

{
  CommsBroker<helics::zeromq::ZmqCommsSS,_helics::CommonCore> *in_stack_000000d0;
  
  CommsBroker<helics::zeromq::ZmqCommsSS,_helics::CommonCore>::~CommsBroker(in_stack_000000d0);
  return;
}

Assistant:

CommsBroker<COMMS, BrokerT>::~CommsBroker()
{
    BrokerBase::haltOperations = true;
    int exp = 2;
    while (!disconnectionStage.compare_exchange_weak(exp, 3)) {
        if (exp == 0) {
            commDisconnect();
            exp = 1;
        } else {
            std::this_thread::sleep_for(std::chrono::milliseconds(50));
        }
    }
    comms = nullptr;  // need to ensure the comms are deleted before the callbacks become invalid
    BrokerBase::joinAllThreads();
}